

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_compress.c
# Opt level: O0

size_t ZSTD_compressEnd(ZSTD_CCtx *cctx,void *dst,size_t dstCapacity,void *src,size_t srcSize)

{
  uint uVar1;
  ZSTD_CCtx *code;
  size_t err_code_1;
  size_t err_code;
  size_t cSize;
  size_t endResult;
  size_t srcSize_local;
  void *src_local;
  size_t dstCapacity_local;
  void *dst_local;
  ZSTD_CCtx *cctx_local;
  
  code = (ZSTD_CCtx *)ZSTD_compressContinue_internal(cctx,dst,dstCapacity,src,srcSize,1,1);
  uVar1 = ERR_isError((size_t)code);
  cctx_local = code;
  if (uVar1 == 0) {
    cctx_local = (ZSTD_CCtx *)
                 ZSTD_writeEpilogue(cctx,(void *)((long)dst + (long)code),dstCapacity - (long)code);
    uVar1 = ERR_isError((size_t)cctx_local);
    if (uVar1 == 0) {
      if ((cctx->pledgedSrcSizePlusOne == 0) ||
         (cctx->pledgedSrcSizePlusOne == cctx->consumedSrcSize + 1)) {
        ZSTD_CCtx_trace(cctx,(size_t)cctx_local);
        cctx_local = (ZSTD_CCtx *)((long)&cctx_local->stage + (long)&code->stage);
      }
      else {
        cctx_local = (ZSTD_CCtx *)0xffffffffffffffb8;
      }
    }
  }
  return (size_t)cctx_local;
}

Assistant:

size_t ZSTD_compressEnd (ZSTD_CCtx* cctx,
                         void* dst, size_t dstCapacity,
                   const void* src, size_t srcSize)
{
    size_t endResult;
    size_t const cSize = ZSTD_compressContinue_internal(cctx,
                                dst, dstCapacity, src, srcSize,
                                1 /* frame mode */, 1 /* last chunk */);
    FORWARD_IF_ERROR(cSize, "ZSTD_compressContinue_internal failed");
    endResult = ZSTD_writeEpilogue(cctx, (char*)dst + cSize, dstCapacity-cSize);
    FORWARD_IF_ERROR(endResult, "ZSTD_writeEpilogue failed");
    assert(!(cctx->appliedParams.fParams.contentSizeFlag && cctx->pledgedSrcSizePlusOne == 0));
    if (cctx->pledgedSrcSizePlusOne != 0) {  /* control src size */
        ZSTD_STATIC_ASSERT(ZSTD_CONTENTSIZE_UNKNOWN == (unsigned long long)-1);
        DEBUGLOG(4, "end of frame : controlling src size");
        RETURN_ERROR_IF(
            cctx->pledgedSrcSizePlusOne != cctx->consumedSrcSize+1,
            srcSize_wrong,
             "error : pledgedSrcSize = %u, while realSrcSize = %u",
            (unsigned)cctx->pledgedSrcSizePlusOne-1,
            (unsigned)cctx->consumedSrcSize);
    }
    ZSTD_CCtx_trace(cctx, endResult);
    return cSize + endResult;
}